

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O1

void __thiscall TestSuite::~TestSuite(TestSuite *this)

{
  pointer pcVar1;
  ulong uVar2;
  double dVar3;
  undefined1 auVar4 [16];
  string time_str;
  string local_30;
  
  auVar4 = std::chrono::_V2::system_clock::now();
  dVar3 = ((double)(auVar4._0_8_ - (this->startTimeGlobal).__d.__r) / 1000000000.0) * 1000000.0;
  uVar2 = (ulong)dVar3;
  usToString_abi_cxx11_
            (&local_30,
             (TestSuite *)((long)(dVar3 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2),
             auVar4._8_8_);
  printf("\x1b[32m%zu\x1b[0m tests passed",this->cntPass);
  if (this->cntFail != 0) {
    printf(", \x1b[31m%zu\x1b[0m tests failed");
  }
  printf(" out of \x1b[36m%zu\x1b[0m (\x1b[33m%s\x1b[0m)\n",this->cntFail + this->cntPass,
         local_30._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  pcVar1 = (this->filter)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->filter).field_2) {
    operator_delete(pcVar1);
  }
  return;
}

Assistant:

~TestSuite() {
        std::chrono::time_point<std::chrono::system_clock> cur_time =
                std::chrono::system_clock::now();;
        std::chrono::duration<double> elapsed = cur_time - startTimeGlobal;
        std::string time_str = usToString
                               ( (uint64_t)(elapsed.count() * 1000000) );

        printf(_CL_GREEN("%zu") " tests passed", cntPass);
        if (cntFail) {
            printf(", " _CL_RED("%zu") " tests failed", cntFail);
        }
        printf(" out of " _CL_CYAN("%zu") " (" _CL_BROWN("%s") ")\n",
               cntPass+cntFail, time_str.c_str());
    }